

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<long_double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<long_double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows)

{
  long lVar1;
  int64_t iVar2;
  long *plVar3;
  int *piVar4;
  int64_t in_RCX;
  TPZVec<long> *in_RDX;
  TPZBlockDiagonal<long_double> *in_RSI;
  TPZBlockDiagonal<long_double> *in_RDI;
  int64_t ibl;
  int64_t numbl;
  int iVar5;
  TPZVec<long> *in_stack_ffffffffffffff78;
  TPZVec<long> *in_stack_ffffffffffffff80;
  void **in_stack_ffffffffffffff98;
  TPZVec<long_double> *newsize;
  long local_50;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSparseBlockDiagonal<long_double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZBlockDiagonal<long_double>::TPZBlockDiagonal(in_RDI,in_stack_ffffffffffffff98);
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSparseBlockDiagonal_02419918;
  TPZVec<long>::TPZVec(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  newsize = &in_RDI[1].fStorage;
  TPZVec<long>::TPZVec(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar2 = TPZVec<long>::NElements(in_RDX);
  TPZVec<int>::Resize((TPZVec<int> *)in_RDI,(int64_t)newsize);
  for (local_50 = 0; local_50 < iVar2 + -1; local_50 = local_50 + 1) {
    plVar3 = TPZVec<long>::operator[](in_RDX,local_50 + 1);
    iVar5 = (int)*plVar3;
    plVar3 = TPZVec<long>::operator[](in_RDX,local_50);
    lVar1 = *plVar3;
    piVar4 = TPZVec<int>::operator[](&in_RDI->fBlockSize,local_50);
    *piVar4 = iVar5 - (int)lVar1;
  }
  TPZBlockDiagonal<long_double>::Initialize(in_RSI,(TPZVec<int> *)in_RDX);
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = in_RCX;
  (in_RDI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = in_RCX;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId), fBlock(blockgraph), fBlockIndex(blockgraphindex)
{
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl;
	for(ibl=0; ibl<numbl; ibl++)
	{
		this->fBlockSize[ibl] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
	}
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}